

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn,int *pbRetryLimit)

{
  int *piVar1;
  u32 *puVar2;
  u16 *puVar3;
  byte *pbVar4;
  double dVar5;
  byte bVar6;
  int iVar7;
  WhereClause *pWVar8;
  sqlite3_index_constraint_usage *__s;
  WhereLoop *pTemplate;
  Parse *pParse;
  SrcList *pSVar9;
  Table *pTVar10;
  sqlite3_vtab *psVar11;
  sqlite3 *db;
  bool bVar12;
  i8 iVar13;
  LogEst LVar14;
  uint uVar15;
  uint uVar16;
  sqlite3_index_constraint *psVar17;
  Table **ppTVar18;
  ulong uVar19;
  VTable *pVVar20;
  WhereTerm *pWVar21;
  char *pcVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  WhereClause *pWVar26;
  int iVar27;
  ulong uVar28;
  int local_6c;
  
  pWVar8 = pBuilder->pWC;
  __s = pIdxInfo->aConstraintUsage;
  pTemplate = pBuilder->pNew;
  pParse = pBuilder->pWInfo->pParse;
  pSVar9 = pBuilder->pWInfo->pTabList;
  bVar6 = pTemplate->iTab;
  iVar7 = pIdxInfo->nConstraint;
  uVar23 = (ulong)iVar7;
  *pbIn = 0;
  pTemplate->prereq = mPrereq;
  if (0 < (long)uVar23) {
    psVar17 = pIdxInfo->aConstraint;
    iVar24 = 0;
    do {
      if (pWVar8 != (WhereClause *)0x0) {
        pWVar26 = pWVar8;
        iVar27 = psVar17->iTermOffset;
        do {
          piVar1 = &pWVar26->nTerm;
          if (iVar27 < *piVar1) {
            pWVar21 = pWVar26->a + iVar27;
            goto LAB_0019ce9d;
          }
          pWVar26 = pWVar26->pOuter;
          iVar27 = iVar27 - *piVar1;
        } while (pWVar26 != (WhereClause *)0x0);
      }
      pWVar21 = (WhereTerm *)0x0;
LAB_0019ce9d:
      psVar17->usable = '\0';
      if ((((pWVar21->prereqRight & ~mUsable) == 0) && ((pWVar21->eOperator & mExclude) == 0)) &&
         ((pbRetryLimit != (int *)0x0 || ((byte)(pWVar21->eMatchOp + 0xb5) < 0xfe)))) {
        psVar17->usable = '\x01';
      }
      iVar24 = iVar24 + 1;
      psVar17 = psVar17 + 1;
    } while (iVar24 != iVar7);
  }
  memset(__s,0,uVar23 * 8);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  *(undefined4 *)&pIdxInfo[1].aOrderBy = 0;
  pTVar10 = pSVar9->a[bVar6].pSTab;
  for (pVVar20 = (pTVar10->u).vtab.p; (pVVar20 != (VTable *)0x0 && (pVVar20->db != pParse->db));
      pVVar20 = pVVar20->pNext) {
  }
  psVar11 = pVVar20->pVtab;
  puVar2 = &pParse->db->nSchemaLock;
  *puVar2 = *puVar2 + 1;
  uVar15 = (*psVar11->pModule->xBestIndex)(psVar11,pIdxInfo);
  db = pParse->db;
  puVar2 = &db->nSchemaLock;
  *puVar2 = *puVar2 - 1;
  if ((uVar15 != 0) && (uVar15 != 0x13)) {
    if (uVar15 == 7) {
      sqlite3OomFault(db);
    }
    else {
      pcVar22 = psVar11->zErrMsg;
      if (pcVar22 == (char *)0x0) {
        if (uVar15 == 0x204) {
          pcVar22 = "abort due to ROLLBACK";
        }
        else if (uVar15 == 0x65) {
          pcVar22 = "no more rows available";
        }
        else if (uVar15 == 100) {
          pcVar22 = "another row available";
        }
        else {
          uVar16 = uVar15 & 0xff;
          pcVar22 = "unknown error";
          if ((uVar16 < 0x1d) && ((0x1410004UL >> ((ulong)uVar16 & 0x3f) & 1) == 0)) {
            pcVar22 = *(char **)(sqlite3ErrStr_aMsg + (ulong)uVar16 * 8);
          }
        }
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar22);
    }
  }
  if (((pTVar10->u).vtab.p)->bAllSchemas != '\0') {
    iVar24 = pParse->db->nDb;
    if (0 < iVar24) {
      iVar27 = 0;
      do {
        sqlite3CodeVerifySchema(pParse,iVar27);
        iVar27 = iVar27 + 1;
      } while (iVar24 != iVar27);
    }
    if ((0 < iVar24) && (pParse->writeMask != 0)) {
      iVar27 = 0;
      do {
        sqlite3BeginWriteOperation(pParse,0,iVar27);
        iVar27 = iVar27 + 1;
      } while (iVar24 != iVar27);
    }
  }
  sqlite3_free(psVar11->zErrMsg);
  psVar11->zErrMsg = (char *)0x0;
  if (uVar15 == 0) {
    ppTVar18 = &pSVar9->a[bVar6].pSTab;
    memset(pTemplate->aLTerm,0,uVar23 * 8);
    *(undefined8 *)&pTemplate->u = 0;
    (pTemplate->u).btree.pIndex = (Index *)0x0;
    (pTemplate->u).btree.pOrderBy = (ExprList *)0x0;
    if (iVar7 < 1) {
      uVar15 = 0xffffffff;
    }
    else {
      psVar17 = pIdxInfo->aConstraint;
      uVar15 = 0xffffffff;
      uVar28 = 0;
      local_6c = 0;
      do {
        iVar24 = __s[uVar28].argvIndex;
        bVar12 = true;
        if (0 < iVar24) {
          if ((iVar24 <= iVar7) && (iVar27 = psVar17->iTermOffset, pWVar26 = pWVar8, -1 < iVar27)) {
            for (; pWVar26 != (WhereClause *)0x0; pWVar26 = pWVar26->pOuter) {
              piVar1 = &pWVar26->nTerm;
              if (iVar27 < *piVar1) {
                pWVar21 = pWVar26->a + iVar27;
                goto LAB_0019d0f6;
              }
              iVar27 = iVar27 - *piVar1;
            }
            pWVar21 = (WhereTerm *)0x0;
LAB_0019d0f6:
            if (pWVar21 != (WhereTerm *)0x0) {
              uVar16 = iVar24 - 1;
              if ((pTemplate->aLTerm[uVar16] == (WhereTerm *)0x0) && (psVar17->usable != '\0')) {
                pTemplate->prereq = pTemplate->prereq | pWVar21->prereqRight;
                pTemplate->aLTerm[uVar16] = pWVar21;
                if ((int)uVar15 < (int)uVar16) {
                  uVar15 = uVar16;
                }
                if (__s[uVar28].omit != '\0') {
                  if ((uVar28 < 0x10) && ((mNoOmit >> ((uint)uVar28 & 0x1f) & 1) == 0)) {
                    puVar3 = &(pTemplate->u).btree.nDistinctCol;
                    *puVar3 = *puVar3 | (ushort)(1 << ((byte)uVar16 & 0x1f));
                  }
                  if (pWVar21->eMatchOp == 'J') {
                    pbVar4 = (byte *)((long)&pTemplate->u + 4);
                    *pbVar4 = *pbVar4 | 2;
                  }
                }
                uVar25 = 1 << ((byte)uVar28 & 0x1f);
                if (0x1f < uVar28) {
                  uVar25 = 0;
                }
                if ((*(uint *)&pIdxInfo[1].aOrderBy & uVar25) == 0) {
                  if ((pWVar21->eOperator & 1) != 0) {
                    pIdxInfo->orderByConsumed = 0;
                    *(byte *)&pIdxInfo->idxFlags = (byte)pIdxInfo->idxFlags & 0xfe;
                    *pbIn = 1;
                  }
                }
                else {
                  puVar2 = &(pTemplate->u).vtab.mHandleIn;
                  *puVar2 = *puVar2 | 1 << ((byte)uVar16 & 0x1f);
                }
                if (0xfd < (byte)(pWVar21->eMatchOp + 0xb5)) {
                  if (*pbIn == 0) {
                    if (uVar28 != 0) {
                      uVar19 = 0;
                      do {
                        if (__s[uVar19].argvIndex < 1) goto LAB_0019d24a;
                        uVar19 = uVar19 + 1;
                      } while (uVar28 != uVar19);
                    }
                  }
                  else {
LAB_0019d24a:
                    if (pIdxInfo->needToFreeIdxStr != 0) {
                      sqlite3_free(pIdxInfo->idxStr);
                      pIdxInfo->idxStr = (char *)0x0;
                      pIdxInfo->needToFreeIdxStr = 0;
                    }
                    *pbRetryLimit = 1;
                    bVar12 = false;
                    local_6c = 0;
                  }
                }
                goto LAB_0019d164;
              }
            }
          }
          sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(*ppTVar18)->zName);
          local_6c = 1;
          if (pIdxInfo->needToFreeIdxStr != 0) {
            sqlite3_free(pIdxInfo->idxStr);
            pIdxInfo->idxStr = (char *)0x0;
            pIdxInfo->needToFreeIdxStr = 0;
          }
          bVar12 = false;
        }
LAB_0019d164:
        if (!bVar12) {
          return local_6c;
        }
        uVar28 = uVar28 + 1;
        psVar17 = psVar17 + 1;
      } while (uVar28 != uVar23);
    }
    pTemplate->nLTerm = (u16)(uVar15 + 1);
    if (-1 < (int)uVar15) {
      uVar23 = 0;
      do {
        if (pTemplate->aLTerm[uVar23] == (WhereTerm *)0x0) {
          sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(*ppTVar18)->zName);
          if (pIdxInfo->needToFreeIdxStr == 0) {
            return 1;
          }
          sqlite3_free(pIdxInfo->idxStr);
          pIdxInfo->idxStr = (char *)0x0;
          pIdxInfo->needToFreeIdxStr = 0;
          return 1;
        }
        uVar23 = uVar23 + 1;
      } while (uVar15 + 1 != uVar23);
    }
    (pTemplate->u).vtab.idxNum = pIdxInfo->idxNum;
    *(byte *)((long)&pTemplate->u + 4) =
         *(byte *)((long)&pTemplate->u + 4) & 0xfe | (byte)pIdxInfo->needToFreeIdxStr & 1;
    pIdxInfo->needToFreeIdxStr = 0;
    (pTemplate->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
    if (pIdxInfo->orderByConsumed == 0) {
      iVar13 = '\0';
    }
    else {
      iVar13 = (i8)pIdxInfo->nOrderBy;
    }
    (pTemplate->u).vtab.isOrdered = iVar13;
    *(byte *)((long)&pTemplate->u + 4) =
         *(byte *)((long)&pTemplate->u + 4) & 0xfb | (char)pIdxInfo->idxFlags * '\x02' & 4U;
    pTemplate->rSetup = 0;
    dVar5 = pIdxInfo->estimatedCost;
    if (dVar5 <= 1.0) {
      LVar14 = 0;
    }
    else if (dVar5 <= 2000000000.0) {
      LVar14 = sqlite3LogEst((long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f |
                             (long)dVar5);
    }
    else {
      LVar14 = (ushort)((ulong)dVar5 >> 0x34) * 10 + -0x27ec;
    }
    pTemplate->rRun = LVar14;
    LVar14 = sqlite3LogEst(pIdxInfo->estimatedRows);
    pTemplate->nOut = LVar14;
    pTemplate->wsFlags = (pIdxInfo->idxFlags & 1U) << 0xc | pTemplate->wsFlags & 0xffffefff;
    uVar15 = whereLoopInsert(pBuilder,pTemplate);
    if ((undefined1  [24])((undefined1  [24])pTemplate->u & (undefined1  [24])0x100000000) !=
        (undefined1  [24])0x0) {
      sqlite3_free((pTemplate->u).btree.pIndex);
      pbVar4 = (byte *)((long)&pTemplate->u + 4);
      *pbVar4 = *pbVar4 & 0xfe;
    }
  }
  else if ((uVar15 == 0x13) && (uVar15 = 0, pIdxInfo->needToFreeIdxStr != 0)) {
    sqlite3_free(pIdxInfo->idxStr);
    pIdxInfo->idxStr = (char *)0x0;
    pIdxInfo->needToFreeIdxStr = 0;
    uVar15 = 0;
  }
  return uVar15;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn,                      /* OUT: True if plan uses an IN(...) op */
  int *pbRetryLimit               /* OUT: Retry without LIMIT/OFFSET */
){
  WhereClause *pWC = pBuilder->pWC;
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  SrcItem *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = termFromWhereClause(pWC, pIdxCons->iTermOffset);
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight
     && (pTerm->eOperator & mExclude)==0
     && (pbRetryLimit || !isLimitTerm(pTerm))
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pHidden->mHandleIn = 0;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pSTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffffffff, ("  ^^^^--- non-viable plan rejected!\n"));
      freeIdxStr(pIdxInfo);
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  memset(pNew->aLTerm, 0, sizeof(pNew->aLTerm[0])*nConstraint );
  memset(&pNew->u.vtab, 0, sizeof(pNew->u.vtab));
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || (pTerm = termFromWhereClause(pWC, j))==0
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pSTab->zName);
        freeIdxStr(pIdxInfo);
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( pUsage[i].omit ){
        if( i<16 && ((1<<i)&mNoOmit)==0 ){
          testcase( i!=iTerm );
          pNew->u.vtab.omitMask |= 1<<iTerm;
        }else{
          testcase( i!=iTerm );
        }
        if( pTerm->eMatchOp==SQLITE_INDEX_CONSTRAINT_OFFSET ){
          pNew->u.vtab.bOmitOffset = 1;
        }
      }
      if( SMASKBIT32(i) & pHidden->mHandleIn ){
        pNew->u.vtab.mHandleIn |= MASKBIT32(iTerm);
      }else if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }

      /* Unless pbRetryLimit is non-NULL, there should be no LIMIT/OFFSET
      ** terms. And if there are any, they should follow all other terms. */
      assert( pbRetryLimit || !isLimitTerm(pTerm) );
      assert( !isLimitTerm(pTerm) || i>=nConstraint-2 );
      assert( !isLimitTerm(pTerm) || i==nConstraint-1 || isLimitTerm(pTerm+1) );

      if( isLimitTerm(pTerm) && (*pbIn || !allConstraintsUsed(pUsage, i)) ){
        /* If there is an IN(...) term handled as an == (separate call to
        ** xFilter for each value on the RHS of the IN) and a LIMIT or
        ** OFFSET term handled as well, the plan is unusable. Similarly,
        ** if there is a LIMIT/OFFSET and there are other unused terms,
        ** the plan cannot be used. In these cases set variable *pbRetryLimit
        ** to true to tell the caller to retry with LIMIT and OFFSET
        ** disabled. */
        freeIdxStr(pIdxInfo);
        *pbRetryLimit = 1;
        return SQLITE_OK;
      }
    }
  }

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pSTab->zName);
      freeIdxStr(pIdxInfo);
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->u.vtab.bIdxNumHex = (pIdxInfo->idxFlags&SQLITE_INDEX_SCAN_HEX)!=0;
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffffffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}